

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O1

Slice __thiscall leveldb::MemTableIterator::value(MemTableIterator *this)

{
  long lVar1;
  Node *pNVar2;
  long in_FS_OFFSET;
  Slice SVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = (this->iter_).node_;
  if (pNVar2 == (Node *)0x0) {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/skiplist.h"
                  ,0xca,
                  "const Key &leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Iterator::key() const [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                 );
  }
  SVar3 = GetLengthPrefixedSlice(pNVar2->key);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    SVar3 = GetLengthPrefixedSlice(SVar3.data_ + SVar3.size_);
    return SVar3;
  }
  __stack_chk_fail();
}

Assistant:

Slice value() const override {
    Slice key_slice = GetLengthPrefixedSlice(iter_.key());
    return GetLengthPrefixedSlice(key_slice.data() + key_slice.size());
  }